

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugLocateItemResolveWithLastItem(void)

{
  undefined1 auVar1 [12];
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ImGuiContext *pIVar6;
  ImDrawList *this;
  ImGuiContext *g;
  uint uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined8 uVar12;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ImVec2 p1;
  ImGuiLastItemData item_data;
  ImVec2 local_78;
  ImVec2 IStack_70;
  ImVec2 local_68;
  ImVec2 local_60;
  undefined8 local_58;
  undefined4 uStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  undefined4 uStack_3c;
  undefined8 uStack_38;
  undefined4 uStack_30;
  undefined4 local_2c;
  float fStack_28;
  ImVec2 IStack_24;
  
  pIVar6 = GImGui;
  local_58._0_4_ = (GImGui->LastItemData).ID;
  local_58._4_4_ = (GImGui->LastItemData).InFlags;
  uVar2 = (GImGui->LastItemData).StatusFlags;
  uVar3 = (GImGui->LastItemData).Rect.Min.x;
  uVar4 = *(undefined8 *)&(GImGui->LastItemData).Rect.Min.y;
  uVar5 = *(undefined8 *)&(GImGui->LastItemData).Rect.Max.y;
  uStack_38 = *(undefined8 *)&(GImGui->LastItemData).NavRect.Min.y;
  uVar12 = *(undefined8 *)&(GImGui->LastItemData).NavRect.Max.y;
  IStack_24 = (GImGui->LastItemData).DisplayRect.Max;
  fStack_28 = (GImGui->LastItemData).DisplayRect.Min.y;
  uStack_30 = (undefined4)uVar12;
  local_2c = (undefined4)((ulong)uVar12 >> 0x20);
  local_48 = (float)uVar4;
  fStack_44 = (float)((ulong)uVar4 >> 0x20);
  fStack_40 = (float)uVar5;
  uStack_3c = (undefined4)((ulong)uVar5 >> 0x20);
  GImGui->DebugLocateId = 0;
  uStack_50 = uVar2;
  fStack_4c = (float)uVar3;
  this = GetViewportDrawList(*(pIVar6->Viewports).Data,1,"##Foreground");
  local_78.x = fStack_4c + -3.0;
  local_78.y = local_48 + -3.0;
  IStack_70.x = fStack_44 + 3.0;
  IStack_70.y = fStack_40 + 3.0;
  local_60 = (pIVar6->IO).MousePos;
  auVar9._8_8_ = 0;
  auVar9._0_4_ = local_60.x;
  auVar9._4_4_ = local_60.y;
  auVar1._4_8_ = uVar12;
  auVar1._0_4_ = local_78.y;
  auVar10._0_8_ = auVar1._0_8_ << 0x20;
  auVar10._8_4_ = IStack_70.x;
  auVar10._12_4_ = IStack_70.y;
  auVar11._12_4_ = IStack_70.y;
  auVar11._8_4_ = IStack_70.x;
  auVar11._0_8_ = auVar10._8_8_;
  auVar9 = minps(auVar11,auVar9);
  uVar7 = -(uint)(local_60.x < local_78.x);
  uVar8 = -(uint)(local_60.y < local_78.y);
  local_68 = (ImVec2)(CONCAT44(~uVar8 & auVar9._4_4_,~uVar7 & auVar9._0_4_) |
                     CONCAT44((uint)local_78.y & uVar8,(uint)local_78.x & uVar7));
  ImDrawList::AddRect(this,&local_78,&IStack_70,0xff00ff00,0.0,0,1.0);
  ImDrawList::AddLine(this,&local_60,&local_68,0xff00ff00,1.0);
  return;
}

Assistant:

void ImGui::DebugLocateItemResolveWithLastItem()
{
    ImGuiContext& g = *GImGui;
    ImGuiLastItemData item_data = g.LastItemData;
    g.DebugLocateId = 0;
    ImDrawList* draw_list = GetForegroundDrawList(g.CurrentWindow);
    ImRect r = item_data.Rect;
    r.Expand(3.0f);
    ImVec2 p1 = g.IO.MousePos;
    ImVec2 p2 = ImVec2((p1.x < r.Min.x) ? r.Min.x : (p1.x > r.Max.x) ? r.Max.x : p1.x, (p1.y < r.Min.y) ? r.Min.y : (p1.y > r.Max.y) ? r.Max.y : p1.y);
    draw_list->AddRect(r.Min, r.Max, DEBUG_LOCATE_ITEM_COLOR);
    draw_list->AddLine(p1, p2, DEBUG_LOCATE_ITEM_COLOR);
}